

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::~IfcRoof(IfcRoof *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x8282a0;
  *(undefined8 *)&this->field_0x30 = 0x8283b8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8282c8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8282f0;
  *(undefined8 *)&this[-1].field_0x118 = 0x828318;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x828340;
  *(undefined8 *)&this[-1].field_0x180 = 0x828368;
  *(undefined8 *)this = 0x828390;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__008283d8);
  operator_delete(&this[-1].field_0x48,400);
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}